

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_image *
rf_gen_image_checked
          (rf_image *__return_storage_ptr__,int width,int height,int checks_x,int checks_y,
          rf_color col1,rf_color col2,rf_allocator allocator)

{
  rf_source_location rVar1;
  undefined1 auVar2 [24];
  int iVar3;
  int iVar4;
  rf_image local_70;
  undefined8 local_58;
  long local_50;
  undefined4 local_48;
  uint uStack_44;
  char *local_40;
  char *local_38;
  undefined8 local_30;
  rf_color *local_28;
  rf_color *dst;
  int dst_size;
  int checks_y_local;
  int checks_x_local;
  int height_local;
  int width_local;
  rf_color col1_local;
  
  dst._4_4_ = checks_y;
  dst_size = checks_x;
  checks_y_local = height;
  checks_x_local = width;
  height_local = (int)col1;
  memset(__return_storage_ptr__,0,0x18);
  iVar3 = checks_x_local * checks_y_local;
  iVar4 = rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8);
  dst._0_4_ = iVar3 * iVar4;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  local_38 = "rf_gen_image_checked";
  local_30 = 0x4250;
  local_58 = 0;
  local_50 = (long)(int)dst;
  local_48 = 0;
  rVar1.proc_name = "rf_gen_image_checked";
  rVar1.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar1.line_in_file = 0x4250;
  auVar2._8_8_ = (ulong)uStack_44 << 0x20;
  auVar2._0_8_ = local_50;
  auVar2._16_8_ = 0;
  local_28 = (rf_color *)
             (*allocator.allocator_proc)
                       (&allocator,rVar1,RF_AM_ALLOC,(rf_allocator_args)(auVar2 << 0x40));
  if (local_28 != (rf_color *)0x0) {
    rf_gen_image_checked_to_buffer
              (&local_70,checks_x_local,checks_y_local,dst_size,dst._4_4_,(rf_color)height_local,
               col2,local_28,(long)(int)dst);
    __return_storage_ptr__->data = local_70.data;
    __return_storage_ptr__->width = local_70.width;
    __return_storage_ptr__->height = local_70.height;
    __return_storage_ptr__->format = local_70.format;
    __return_storage_ptr__->valid = local_70.valid;
    *(undefined3 *)&__return_storage_ptr__->field_0x15 = local_70._21_3_;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_gen_image_checked(int width, int height, int checks_x, int checks_y, rf_color col1, rf_color col2, rf_allocator allocator)
{
    rf_image result = {0};

    int dst_size = width * height * rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8);
    rf_color* dst = RF_ALLOC(allocator, dst_size);

    if (dst)
    {
        result = rf_gen_image_checked_to_buffer(width, height, checks_x, checks_y, col1, col2, dst, dst_size);
    }

    return result;
}